

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int create_hashtable(hash_table_t *table,size_t initial_size,hash_func_t hashfunc,hash_cmp_t keycmp)

{
  int iVar1;
  hash_entry_t *phVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = getpagesize();
  uVar4 = (ulong)(int)((ulong)(long)iVar1 / 0x30);
  iVar1 = 0;
  uVar3 = initial_size % uVar4;
  lVar5 = uVar4 - uVar3;
  if (uVar3 == 0) {
    lVar5 = 0;
  }
  phVar2 = (hash_entry_t *)calloc(1,(lVar5 + initial_size) * 0x30);
  if (phVar2 == (hash_entry_t *)0x0) {
    iVar1 = -1;
  }
  else {
    table->table_size = lVar5 + initial_size;
    table->entry_count = 0;
    table->hashfunc = hashfunc;
    table->keycmp = keycmp;
    table->table = phVar2;
    table->head = (hash_entry_t *)0x0;
  }
  return iVar1;
}

Assistant:

int create_hashtable(hash_table_t *table, size_t initial_size, hash_func_t hashfunc, 
                     hash_cmp_t keycmp)
{
   hash_entry_t *newtable;
   int entries_per_page;

   entries_per_page = gotcha_getpagesize() / sizeof(hash_entry_t);
   if (initial_size % entries_per_page)
      initial_size += entries_per_page - (initial_size % entries_per_page);

   newtable = (hash_entry_t *) gotcha_malloc(initial_size * sizeof(hash_entry_t));
   if (!newtable)
      return -1;
   gotcha_memset(newtable, 0, initial_size * sizeof(hash_entry_t));

   table->table_size = initial_size;
   table->entry_count = 0;
   table->hashfunc = hashfunc;
   table->keycmp = keycmp;
   table->table = newtable;
   table->head = NULL;
   
   return 0;
}